

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O0

TestResult *
JsonTest::checkEqual<long_long,float>
          (TestResult *result,longlong expected,float actual,char *file,uint line,char *expr)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  TestResult *in_RSI;
  TestResult *in_RDI;
  float in_XMM0_Da;
  char (*in_stack_00000178) [11];
  TestResult *in_stack_00000180;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (((float)(long)in_RSI != in_XMM0_Da) || (NAN((float)(long)in_RSI) || NAN(in_XMM0_Da))) {
    TestResult::addFailure
              (in_RSI,(char *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
               (uint)((ulong)in_RDX >> 0x20),(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(float *)in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(char (*) [2])in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(float *)in_stack_00000178);
  }
  return in_RDI;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}